

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.h
# Opt level: O3

void __thiscall
gimage::Histogram::Histogram<unsigned_char>
          (Histogram *this,Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *image,
          int binsize)

{
  unsigned_long *puVar1;
  int iVar2;
  uchar ***pppuVar3;
  unsigned_long *puVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  
  this->bs = 0;
  this->w = 0;
  this->h = 0;
  this->val = (unsigned_long *)0x0;
  this->row = (unsigned_long **)0x0;
  lVar8 = image->n;
  lVar7 = -lVar8;
  if (0 < lVar8) {
    lVar7 = lVar8;
  }
  if (lVar8 == 0) {
    uVar6 = 0;
  }
  else {
    lVar8 = 0;
    uVar6 = 0;
    do {
      uVar5 = uVar6;
      uVar6 = (uint)image->pixel[lVar8];
      if (image->pixel[lVar8] < uVar5) {
        uVar6 = uVar5;
      }
      lVar8 = lVar8 + 1;
    } while (lVar7 != lVar8);
    if (0xffff < uVar5) {
      uVar6 = 0x10000;
    }
  }
  uVar5 = 0x100;
  if (0x100 < uVar6) {
    uVar5 = uVar6;
  }
  setSize(this,(int)uVar5 / binsize,1,binsize);
  uVar6 = this->h * this->w;
  if (0 < (int)uVar6) {
    memset(this->val,0,(ulong)uVar6 << 3);
  }
  lVar8 = image->height;
  if (0 < lVar8) {
    uVar6 = image->depth;
    lVar7 = image->width;
    lVar9 = 0;
    do {
      if (0 < lVar7) {
        pppuVar3 = image->img;
        iVar2 = this->w;
        lVar8 = 0;
        do {
          if (0 < (int)uVar6) {
            puVar4 = this->val;
            uVar10 = 0;
            do {
              if ((int)(uint)pppuVar3[uVar10][lVar9][lVar8] < (iVar2 + 1) * binsize + -1) {
                puVar1 = puVar4 + (int)((long)(ulong)pppuVar3[uVar10][lVar9][lVar8] / (long)binsize)
                ;
                *puVar1 = *puVar1 + 1;
              }
              uVar10 = uVar10 + 1;
            } while (uVar6 != uVar10);
            lVar7 = image->width;
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 < lVar7);
        lVar8 = image->height;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < lVar8);
  }
  return;
}

Assistant:

Histogram(const Image<T> &image, int binsize=1)
    {
      w=h=bs=0;
      val=0;
      row=0;

      int width=std::max(256, std::min(65536, static_cast<int>(image.maxValue())))/binsize;
      setSize(width, 1, binsize);
      clear();

      for (int k=0; k<image.getHeight(); k++)
      {
        for (int i=0; i<image.getWidth(); i++)
        {
          if (image.isValid(i, k))
          {
            for (int d=0; d<image.getDepth(); d++)
            {
              T v=image.get(i, k, d);

              if (v < w*binsize+binsize-1)
              {
                val[static_cast<int>(v)/binsize]++;
              }
            }
          }
        }
      }
    }